

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

uint16 * rw::d3d::lockIndices(void *indexBuffer,uint32 offset,uint32 size,uint32 flags)

{
  uint32 flags_local;
  uint32 size_local;
  uint32 offset_local;
  void *indexBuffer_local;
  
  indexBuffer_local = indexBuffer;
  if (indexBuffer == (void *)0x0) {
    indexBuffer_local = (void *)0x0;
  }
  return (uint16 *)indexBuffer_local;
}

Assistant:

uint16*
lockIndices(void *indexBuffer, uint32 offset, uint32 size, uint32 flags)
{
	if(indexBuffer == nil)
		return nil;
#ifdef RW_D3D9
	uint16 *indices;
	IDirect3DIndexBuffer9 *ibuf = (IDirect3DIndexBuffer9*)indexBuffer;
	ibuf->Lock(offset, size, (void**)&indices, flags);
	return indices;
#else
	(void)offset;
	(void)size;
	(void)flags;
	return (uint16*)indexBuffer;
#endif
}